

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O1

void __thiscall
deqp::gls::StateChangePerformanceCase::requireCoordBuffers
          (StateChangePerformanceCase *this,int count)

{
  uint uVar1;
  iterator __position;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  uint uVar5;
  GLuint buffer;
  vector<float,_std::allocator<float>_> coords;
  float local_5c;
  vector<float,_std::allocator<float>_> local_58;
  int local_3c;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  long lVar4;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if ((int)((ulong)((long)(this->m_coordBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_coordBuffers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < count) {
    local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_coordBuffers;
    local_3c = count;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(long)count);
    local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (float *)0x0;
    local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (float *)0x0;
    uVar1 = this->m_triangleCount;
    std::vector<float,_std::allocator<float>_>::reserve(&local_58,(long)(int)(uVar1 * 6));
    if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        if ((uVar5 & 1) == 0) {
          local_5c = -1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = -1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_5c = -1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = -1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_5c = 1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = 1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_5c = -1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = -1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_5c = 1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = 1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_5c = 1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
LAB_00984028:
            local_5c = 1.0;
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = 1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_5c = -1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = -1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_5c = -1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = -1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_5c = -1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = -1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_5c = 1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = 1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_5c = 1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_5c);
          }
          else {
            *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = 1.0;
            local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_5c = 1.0;
          if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_00984028;
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_5c);
        }
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    if ((int)((ulong)((long)(this->m_coordBuffers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->m_coordBuffers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) < local_3c) {
      do {
        (**(code **)(lVar4 + 0x6c8))(1,&local_5c);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glGenBuffers()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x117);
        (**(code **)(lVar4 + 0x40))(0x8892,local_5c);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glBindBuffer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x11a);
        (**(code **)(lVar4 + 0x150))
                  (0x8892,(long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                   local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,0x88e4);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glBufferData()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x11c);
        (**(code **)(lVar4 + 0x40))(0x8892,0);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glBindBuffer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x11e);
        __position._M_current =
             (this->m_coordBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_coordBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_38,__position,(uint *)&local_5c);
        }
        else {
          *__position._M_current = (uint)local_5c;
          (this->m_coordBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      } while ((int)((ulong)((long)(this->m_coordBuffers).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_coordBuffers).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) < local_3c);
    }
    if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireCoordBuffers (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if ((int)m_coordBuffers.size() >= count)
		return;

	m_coordBuffers.reserve(count);

	vector<GLfloat> coords;
	genCoords(coords, m_triangleCount);

	while ((int)m_coordBuffers.size() < count)
	{
		GLuint buffer;

		gl.genBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers()");

		gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
		gl.bufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(GLfloat)), &(coords[0]), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData()");
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		m_coordBuffers.push_back(buffer);
	}
}